

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__6>
               (json *_v,char *member,anon_class_32_4_9f7a1e9d *cb)

{
  char cVar1;
  _Alloc_hider _Var2;
  mapped_type_conflict mVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  reference pbVar7;
  string *o;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  key_type *pkVar9;
  mapped_type_conflict *pmVar10;
  undefined8 *puVar11;
  byte bVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *pjVar14;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  json *extraout_RDX_05;
  undefined8 uVar15;
  undefined1 required;
  undefined8 uVar16;
  string *parent_node;
  Primitive *this;
  json_const_iterator dictIt;
  json_const_iterator it_1;
  json_const_array_iterator i_1;
  json_const_iterator targetsObject;
  int indices;
  int mode;
  int material;
  json_const_iterator dictItEnd_1;
  json_const_iterator dictIt_1;
  json_const_iterator primObject;
  Primitive primitive;
  json_const_array_iterator i;
  json_const_array_iterator primEnd;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string local_4f8;
  undefined1 local_4d8 [8];
  iterator iStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Base_ptr local_4b8;
  size_t local_4b0;
  string *local_4a8;
  string *local_4a0;
  key_type local_498;
  allocator local_471;
  string *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  int local_43c;
  int local_438;
  int local_434;
  key_type local_430;
  char *local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d8;
  Value *local_3c8;
  size_t *local_3c0;
  json_const_iterator local_3b8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Base_ptr local_378;
  size_t local_370;
  undefined8 local_368;
  int local_360;
  pointer local_358;
  pointer pmStack_350;
  pointer local_348;
  ExtensionMap local_340;
  Value VStack_310;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_230;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_210;
  undefined1 local_1f0 [280];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  json_const_iterator local_98;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_410 = member;
  bVar5 = FindMember(_v,"meshes",&local_98);
  if ((bVar5) &&
     (pbVar7 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar7->m_type == array)) {
    pbVar7 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_70.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_70.m_object = pbVar7;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_begin(&local_70);
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_50.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_50.m_object = pbVar7;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end(&local_50);
    bVar5 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_70,&local_50);
    if (!bVar5) {
      local_3c0 = &local_340._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_3c8 = (Value *)(local_1f0 + 0x80);
      do {
        o = (string *)
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*(&local_70);
        if (*(value_t *)&(o->_M_dataplus)._M_p != object) {
          if ((char *)**(undefined8 **)local_410 != (char *)0x0) {
            std::__cxx11::string::append((char *)**(undefined8 **)local_410);
          }
          return false;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1f0._88_4_ = _S_red;
        local_1f0._96_8_ = (_Base_ptr)0x0;
        local_1f0._64_8_ = (pointer)0x0;
        local_1f0._72_8_ = (pointer)0x0;
        local_1f0._48_8_ = (pointer)0x0;
        local_1f0._56_8_ = (pointer)0x0;
        local_1f0._32_8_ = (Primitive *)0x0;
        local_1f0._40_8_ = (Primitive *)0x0;
        local_1f0._104_8_ = local_1f0 + 0x58;
        local_1f0._136_8_ = 0.0;
        local_1f0._120_8_ = 0;
        local_1f0._128_4_ = 0;
        local_1f0._132_4_ = 0;
        local_1f0._144_8_ = local_1f0 + 0xa0;
        local_1f0._152_8_ = 0;
        local_1f0[0xa0] = '\0';
        local_1f0._232_4_ = _S_red;
        local_1f0._240_8_ = (_Base_ptr)0x0;
        local_1f0._208_8_ = (pointer)0x0;
        local_1f0._216_8_ = (pointer)0x0;
        local_1f0._192_8_ = (pointer)0x0;
        local_1f0._200_8_ = (pointer)0x0;
        local_1f0._176_8_ = (pointer)0x0;
        local_1f0._184_8_ = (pointer)0x0;
        local_1f0._248_8_ = local_1f0 + 0xe8;
        local_1f0._264_8_ = 0;
        local_1f0[0x110] = false;
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_4a8 = (string *)**(undefined8 **)local_410;
        cVar1 = *(char *)(*(long *)(local_410 + 0x18) + 0x19);
        local_398._0_8_ = &local_388;
        local_398._8_8_ = 4;
        local_388._M_allocated_capacity._0_5_ = 0x656d616e;
        iStack_4d0._M_node = (_Base_ptr)0x0;
        local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398;
        uVar16 = 0;
        parent_node = (string *)local_4d8;
        local_4d8 = (undefined1  [8])&local_4c8;
        local_470 = o;
        local_1f0._112_8_ = local_1f0._104_8_;
        local_1f0._256_8_ = local_1f0._248_8_;
        ParseStringProperty((string *)local_1f0,local_4a8,(json *)o,(string *)paVar13,false,
                            parent_node);
        if (local_4d8 != (undefined1  [8])&local_4c8) {
          operator_delete((void *)local_4d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ != &local_388) {
          operator_delete((void *)local_398._0_8_);
        }
        uVar4 = local_1f0._40_8_;
        uVar15 = local_1f0._32_8_;
        this = (Primitive *)local_1f0._32_8_;
        if (local_1f0._40_8_ != local_1f0._32_8_) {
          do {
            Primitive::~Primitive(this);
            this = this + 1;
          } while (this != (Primitive *)uVar4);
          local_1f0._40_8_ = uVar15;
        }
        local_3b8.m_object = (pointer)0x0;
        local_3b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_3b8.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_3b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
        bVar5 = FindMember((json *)local_470,"primitives",&local_3b8);
        required = (undefined1)uVar16;
        if (bVar5) {
          pbVar7 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_3b8);
          required = (undefined1)uVar16;
          if (pbVar7->m_type == array) {
            local_210.m_object =
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_3b8);
            local_210.m_it.object_iterator._M_node = (_Base_ptr)0x0;
            local_210.m_it.array_iterator._M_current =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0;
            local_210.m_it.primitive_iterator.m_it = -0x8000000000000000;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::set_end(&local_210);
            local_230.m_object =
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_3b8);
            local_230.m_it.object_iterator._M_node = (_Base_ptr)0x0;
            local_230.m_it.array_iterator._M_current =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0;
            local_230.m_it.primitive_iterator.m_it = -0x8000000000000000;
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::set_begin(&local_230);
            bVar5 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::
                    operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                              (&local_230,&local_210);
            while( true ) {
              required = (undefined1)uVar16;
              if (bVar5 != false) break;
              local_398._8_8_ = local_398._8_8_ & 0xffffffff00000000;
              local_388._M_allocated_capacity = 0;
              local_388._8_8_ = local_398 + 8;
              local_370 = 0;
              local_368._0_4_ = -1;
              local_368._4_4_ = -1;
              local_360 = -1;
              local_348 = (pointer)0x0;
              local_358 = (pointer)0x0;
              pmStack_350 = (pointer)0x0;
              local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_340._M_t._M_impl.super__Rb_tree_header._M_header;
              local_3c0[2] = 0;
              *local_3c0 = 0;
              local_3c0[1] = 0;
              VStack_310.string_value_._M_dataplus._M_p = (pointer)&VStack_310.string_value_.field_2
              ;
              VStack_310.string_value_._M_string_length = 0;
              VStack_310.string_value_.field_2._M_local_buf[0] = '\0';
              VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              VStack_310.array_value_.
              super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              VStack_310.array_value_.
              super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              VStack_310.binary_value_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              VStack_310.array_value_.
              super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              VStack_310.binary_value_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              VStack_310.binary_value_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
              VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              VStack_310.boolean_value_ = false;
              local_278._M_p = (pointer)&local_268;
              local_270 = 0;
              local_268._M_local_buf[0] = '\0';
              local_258._M_p = (pointer)&local_248;
              local_250 = 0;
              local_248._M_local_buf[0] = '\0';
              local_378 = (_Base_ptr)local_388._8_8_;
              local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_340._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   VStack_310.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              local_4a0 = (string *)
                          nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator*(&local_230);
              local_434 = -1;
              local_4d8 = (undefined1  [8])&local_4c8;
              local_4c8._M_allocated_capacity = 0x6c6169726574616d;
              iStack_4d0._M_node = (_Base_ptr)0x8;
              local_4c8._8_8_ = local_4c8._8_8_ & 0xffffffffffffff00;
              local_4f8._M_string_length = 0;
              local_4f8.field_2._M_allocated_capacity =
                   local_4f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              ParseIntegerProperty
                        (&local_434,local_4a8,(json *)local_4a0,(string *)local_4d8,false,&local_4f8
                        );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p);
              }
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8);
              }
              local_368._0_4_ = local_434;
              local_438 = 4;
              local_4d8 = (undefined1  [8])&local_4c8;
              iStack_4d0._M_node = (_Base_ptr)0x4;
              local_4c8._M_allocated_capacity._0_5_ = 0x65646f6d;
              local_4f8._M_string_length = 0;
              local_4f8.field_2._M_allocated_capacity =
                   local_4f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              ParseIntegerProperty
                        (&local_438,local_4a8,(json *)local_4a0,(string *)local_4d8,false,&local_4f8
                        );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p);
              }
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8);
              }
              local_360 = local_438;
              local_43c = -1;
              local_4d8 = (undefined1  [8])&local_4c8;
              local_4c8._M_allocated_capacity = 0x73656369646e69;
              iStack_4d0._M_node = (_Base_ptr)0x7;
              local_4f8._M_string_length = 0;
              local_4f8.field_2._M_allocated_capacity =
                   local_4f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              uVar16 = 0;
              parent_node = &local_4f8;
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              ParseIntegerProperty
                        (&local_43c,local_4a8,(json *)local_4a0,(string *)local_4d8,false,
                         parent_node);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                operator_delete(local_4f8._M_dataplus._M_p);
              }
              if (local_4d8 != (undefined1  [8])&local_4c8) {
                operator_delete((void *)local_4d8);
              }
              local_368._4_4_ = local_43c;
              local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
              local_408.field_2._M_allocated_capacity = 0x7475626972747461;
              local_408._M_string_length = 10;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
              local_408.field_2._8_3_ = 0x7365;
              local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
              local_430.field_2._M_allocated_capacity = 0x766974696d697250;
              local_430.field_2._M_local_buf[8] = 'e';
              local_430._M_string_length = 9;
              local_430.field_2._M_local_buf[9] = '\0';
              local_4d8 = (undefined1  [8])0x0;
              iStack_4d0._M_node = (_Base_ptr)0x0;
              local_4c8._M_allocated_capacity = 0;
              local_4c8._8_8_ = (undefined1 *)0x8000000000000000;
              bVar5 = FindMember((json *)local_4a0,local_408._M_dataplus._M_p,
                                 (json_const_iterator *)local_4d8);
              if (bVar5) {
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         *)local_4d8);
                if (paVar8->_M_local_buf[0] != '\x01') {
                  if (local_4a8 != (string *)0x0) {
                    std::operator+(&local_468,"\'",&local_408);
                    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_468);
                    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11 == paVar13) {
                      local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_4f8.field_2._8_8_ = puVar11[3];
                    }
                    else {
                      local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_4f8._M_dataplus._M_p = (pointer)*puVar11;
                    }
                    local_4f8._M_string_length = puVar11[1];
                    *puVar11 = paVar13;
                    puVar11[1] = 0;
                    *(undefined1 *)(puVar11 + 2) = 0;
                    std::__cxx11::string::_M_append
                              ((char *)local_4a8,(ulong)local_4f8._M_dataplus._M_p);
LAB_0011473c:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                      operator_delete(local_4f8._M_dataplus._M_p);
                    }
                    paVar8 = &local_468.field_2;
                    uVar15 = local_468._M_dataplus._M_p;
                    goto LAB_001147b4;
                  }
                  goto LAB_001147be;
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_398);
                local_4f8._M_string_length = 0;
                local_4f8.field_2._M_allocated_capacity = 0;
                local_4f8.field_2._8_8_ = 0x8000000000000000;
                local_4f8._M_dataplus._M_p = (pointer)paVar8;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_begin((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_4f8);
                local_468._M_string_length = 0;
                local_468.field_2._M_allocated_capacity = 0;
                local_468.field_2._8_8_ = 0x8000000000000000;
                local_468._M_dataplus._M_p = (pointer)paVar8;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&local_468);
                bVar6 = nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_4f8,
                                   (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_468);
                bVar5 = true;
                while (!bVar6) {
                  pbVar7 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_4f8);
                  bVar12 = pbVar7->m_type - number_integer;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71((int7)((ulong)paVar13 >> 8),bVar12);
                  if (1 < bVar12) {
                    if (local_4a8 == (string *)0x0) goto LAB_001147be;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_3e8,"\'",&local_408);
                    puVar11 = (undefined8 *)std::__cxx11::string::append(local_3e8._M_local_buf);
                    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11 == paVar13) {
                      local_498.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_498.field_2._8_8_ = puVar11[3];
                    }
                    else {
                      local_498.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_498._M_dataplus._M_p = (pointer)*puVar11;
                    }
                    local_498._M_string_length = puVar11[1];
                    *puVar11 = paVar13;
                    puVar11[1] = 0;
                    *(undefined1 *)(puVar11 + 2) = 0;
                    std::__cxx11::string::_M_append
                              ((char *)local_4a8,(ulong)local_498._M_dataplus._M_p);
                    goto LAB_0011478d;
                  }
                  local_498._M_dataplus._M_p = (pointer)0x0;
                  nlohmann::detail::
                  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                            (pbVar7,(long *)&local_498);
                  _Var2._M_p = local_498._M_dataplus._M_p;
                  pkVar9 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_4f8);
                  std::__cxx11::string::string
                            ((string *)&local_498,(pkVar9->_M_dataplus)._M_p,
                             (allocator *)local_3e8._M_local_buf);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)local_398,&local_498);
                  *pmVar10 = (mapped_type_conflict)_Var2._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._M_dataplus._M_p != &local_498.field_2) {
                    operator_delete(local_498._M_dataplus._M_p);
                  }
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)&local_4f8);
                  bVar6 = nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::
                          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                    ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_4f8,
                                     (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_468);
                }
              }
              else {
                if (local_4a8 != (string *)0x0) {
                  if (local_430._M_string_length == 0) {
                    std::operator+(&local_468,"\'",&local_408);
                    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_468);
                    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11 == paVar13) {
                      local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_4f8.field_2._8_8_ = puVar11[3];
                    }
                    else {
                      local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                      local_4f8._M_dataplus._M_p = (pointer)*puVar11;
                    }
                    local_4f8._M_string_length = puVar11[1];
                    *puVar11 = paVar13;
                    puVar11[1] = 0;
                    *(undefined1 *)(puVar11 + 2) = 0;
                    std::__cxx11::string::_M_append
                              ((char *)local_4a8,(ulong)local_4f8._M_dataplus._M_p);
                    goto LAB_0011473c;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_3e8,"\'",&local_408);
                  puVar11 = (undefined8 *)std::__cxx11::string::append(local_3e8._M_local_buf);
                  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar13) {
                    local_498.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_498.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_498.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_498._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_498._M_string_length = puVar11[1];
                  *puVar11 = paVar13;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_498,(ulong)local_430._M_dataplus._M_p);
                  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar13) {
                    local_468.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_468.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_468.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_468._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_468._M_string_length = puVar11[1];
                  *puVar11 = paVar13;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_468);
                  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar13) {
                    local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_4f8.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_4f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_4f8._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_4f8._M_string_length = puVar11[1];
                  *puVar11 = paVar13;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_4a8,(ulong)local_4f8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                    operator_delete(local_4f8._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._M_dataplus._M_p != &local_468.field_2) {
                    operator_delete(local_468._M_dataplus._M_p);
                  }
LAB_0011478d:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._M_dataplus._M_p != &local_498.field_2) {
                    operator_delete(local_498._M_dataplus._M_p);
                  }
                  paVar8 = &aStack_3d8;
                  uVar15 = local_3e8._M_allocated_capacity;
LAB_001147b4:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)uVar15 != paVar8) {
                    operator_delete((void *)uVar15);
                  }
                }
LAB_001147be:
                bVar5 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_430._M_dataplus._M_p != &local_430.field_2) {
                operator_delete(local_430._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._M_dataplus._M_p != &local_408.field_2) {
                operator_delete(local_408._M_dataplus._M_p);
              }
              if (bVar5) {
                local_468._M_dataplus._M_p = (pointer)0x0;
                local_468._M_string_length = 0;
                local_468.field_2._M_allocated_capacity = 0;
                local_468.field_2._8_8_ = 0x8000000000000000;
                bVar5 = FindMember((json *)local_4a0,"targets",(json_const_iterator *)&local_468);
                pjVar14 = extraout_RDX;
                if ((bVar5) &&
                   (pbVar7 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_468), pjVar14 = extraout_RDX_00,
                   pbVar7->m_type == array)) {
                  local_4f8._M_dataplus._M_p =
                       (pointer)nlohmann::detail::
                                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             *)&local_468);
                  local_4f8._M_string_length = 0;
                  local_4f8.field_2._M_allocated_capacity = 0;
                  local_4f8.field_2._8_8_ = 0x8000000000000000;
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_4f8);
                  local_498._M_dataplus._M_p =
                       (pointer)nlohmann::detail::
                                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             *)&local_468);
                  local_498._M_string_length = 0;
                  local_498.field_2._M_allocated_capacity = 0;
                  local_498.field_2._8_8_ = 0x8000000000000000;
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::set_begin((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_498);
                  bVar5 = nlohmann::detail::
                          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::
                          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                    ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_498,
                                     (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_4f8);
                  pjVar14 = extraout_RDX_01;
                  while (bVar5 == false) {
                    iStack_4d0._M_node = iStack_4d0._M_node & 0xffffffff00000000;
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                    local_4c8._M_allocated_capacity = 0;
                    local_4c8._8_8_ = local_4d8 + 8;
                    local_4b0 = 0;
                    local_4b8 = (_Base_ptr)local_4c8._8_8_;
                    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)nlohmann::detail::
                                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             *)&local_498);
                    if (paVar8->_M_local_buf[0] == '\x01') {
                      local_3e8._8_8_ = 0;
                      aStack_3d8._M_allocated_capacity = 0;
                      aStack_3d8._8_8_ = 0x8000000000000000;
                      local_3e8._M_allocated_capacity = (size_type)paVar8;
                      nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::set_begin((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&local_3e8);
                      local_408._M_string_length = 0;
                      local_408.field_2._M_allocated_capacity = 0;
                      local_408.field_2._8_8_ = 0x8000000000000000;
                      local_408._M_dataplus._M_p = (pointer)paVar8;
                      nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_408);
                      while (bVar5 = nlohmann::detail::
                                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::
                                     operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                               ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 *)&local_3e8,
                                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 *)&local_408), !bVar5) {
                        pbVar7 = nlohmann::detail::
                                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              *)&local_3e8);
                        bVar12 = pbVar7->m_type - number_integer;
                        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71((int7)((ulong)paVar13 >> 8),bVar12);
                        if (bVar12 < 2) {
                          local_430._M_dataplus._M_p = (pointer)0x0;
                          nlohmann::detail::
                          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                                    (pbVar7,(long *)&local_430);
                          mVar3 = (mapped_type_conflict)local_430._M_dataplus._M_p;
                          pkVar9 = nlohmann::detail::
                                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_3e8);
                          std::__cxx11::string::string
                                    ((string *)&local_430,(pkVar9->_M_dataplus)._M_p,&local_471);
                          pmVar10 = std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_4d8,&local_430);
                          *pmVar10 = mVar3;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_430._M_dataplus._M_p != &local_430.field_2) {
                            operator_delete(local_430._M_dataplus._M_p);
                          }
                        }
                        nlohmann::detail::
                        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_3e8);
                      }
                      std::
                      vector<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,std::allocator<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
                      ::
                      emplace_back<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                                ((vector<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,std::allocator<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
                                  *)&local_358,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)local_4d8);
                    }
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)local_4d8);
                    nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_498);
                    bVar5 = nlohmann::detail::
                            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ::
                            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                      ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_498,
                                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        *)&local_4f8);
                    pjVar14 = extraout_RDX_02;
                  }
                }
                ParseExtensionsProperty(&local_340,local_4a0,pjVar14);
                ParseExtrasProperty(&VStack_310,(json *)local_4a0);
                if (cVar1 != '\0') {
                  local_4d8 = (undefined1  [8])0x0;
                  iStack_4d0._M_node = (_Base_ptr)0x0;
                  local_4c8._M_allocated_capacity = 0;
                  local_4c8._8_8_ = 0x8000000000000000;
                  bVar5 = FindMember((json *)local_4a0,"extensions",(json_const_iterator *)local_4d8
                                    );
                  if (bVar5) {
                    pbVar7 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_4d8);
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x20;
                    uVar16 = 0;
                    parent_node = (string *)0x0;
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_4f8,pbVar7,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_258,(string *)&local_4f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                      operator_delete(local_4f8._M_dataplus._M_p);
                    }
                  }
                  local_4d8 = (undefined1  [8])0x0;
                  iStack_4d0._M_node = (_Base_ptr)0x0;
                  local_4c8._M_allocated_capacity = 0;
                  local_4c8._8_8_ = (undefined1 *)0x8000000000000000;
                  bVar5 = FindMember((json *)local_4a0,"extras",(json_const_iterator *)local_4d8);
                  if (bVar5) {
                    pbVar7 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)local_4d8);
                    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x20;
                    uVar16 = 0;
                    parent_node = (string *)0x0;
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_4f8,pbVar7,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_278,(string *)&local_4f8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                      operator_delete(local_4f8._M_dataplus._M_p);
                    }
                  }
                }
                std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::
                emplace_back<tinygltf::Primitive>
                          ((vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_> *)
                           (local_1f0 + 0x20),(Primitive *)local_398);
              }
              Primitive::~Primitive((Primitive *)local_398);
              nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator++(&local_230);
              bVar5 = nlohmann::detail::
                      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                (&local_230,&local_210);
            }
          }
        }
        local_398._0_8_ = &local_388;
        local_388._M_allocated_capacity = 0x73746867696577;
        local_398._8_8_ = 7;
        iStack_4d0._M_node = (_Base_ptr)0x0;
        local_4c8._M_allocated_capacity = local_4c8._M_allocated_capacity & 0xffffffffffffff00;
        local_4d8 = (undefined1  [8])&local_4c8;
        ParseNumberArrayProperty
                  ((vector<double,_std::allocator<double>_> *)(local_1f0 + 0x38),local_470,
                   (json *)local_398._0_8_,(string *)paVar13,(bool)required,parent_node);
        pjVar14 = extraout_RDX_03;
        if (local_4d8 != (undefined1  [8])&local_4c8) {
          operator_delete((void *)local_4d8);
          pjVar14 = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ != &local_388) {
          operator_delete((void *)local_398._0_8_);
          pjVar14 = extraout_RDX_05;
        }
        ParseExtensionsProperty((ExtensionMap *)(local_1f0 + 0x50),local_470,pjVar14);
        ParseExtrasProperty(local_3c8,(json *)local_470);
        if (cVar1 != '\0') {
          local_398._0_8_ = 0;
          local_398._8_8_ = 0;
          local_388._M_allocated_capacity = 0;
          local_388._8_8_ = 0x8000000000000000;
          bVar5 = FindMember((json *)local_470,"extensions",(json_const_iterator *)local_398);
          if (bVar5) {
            pbVar7 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_398);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump((string_t *)local_4d8,pbVar7,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)local_4d8);
            if (local_4d8 != (undefined1  [8])&local_4c8) {
              operator_delete((void *)local_4d8);
            }
          }
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_398._8_8_ = 0;
          local_388._M_allocated_capacity = 0;
          local_388._8_8_ = (undefined1 *)0x8000000000000000;
          bVar5 = FindMember((json *)local_470,"extras",(json_const_iterator *)local_398);
          if (bVar5) {
            pbVar7 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_398);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump((string_t *)local_4d8,pbVar7,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)local_4d8);
            if (local_4d8 != (undefined1  [8])&local_4c8) {
              operator_delete((void *)local_4d8);
            }
          }
        }
        std::vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>::emplace_back<tinygltf::Mesh>
                  ((vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_> *)
                   (**(long **)(local_410 + 8) + 0x78),(Mesh *)local_1f0);
        Mesh::~Mesh((Mesh *)local_1f0);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_70);
        bVar5 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_70,&local_50);
      } while (!bVar5);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}